

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode InitiateTransfer(Curl_easy *data)

{
  connectdata *conn_00;
  CURLcode CVar1;
  connectdata *conn;
  CURLcode result;
  Curl_easy *data_local;
  
  conn_00 = data->conn;
  if ((*(uint *)&(conn_00->bits).field_0x4 >> 0x14 & 1) != 0) {
    Curl_infof(data,"Doing the SSL/TLS handshake on the data stream");
    CVar1 = Curl_ssl_connect(data,conn_00,1);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
  }
  if ((conn_00->proto).ftpc.state_saved == FTP_STOR) {
    Curl_pgrsSetUploadSize(data,(data->state).infilesize);
    Curl_setup_transfer(data,-1,-1,false,1);
  }
  else {
    Curl_setup_transfer(data,1,(conn_00->proto).ftpc.retr_size_saved,false,-1);
  }
  (conn_00->proto).httpc.binsettings[0x20] = '\x01';
  _state(data,FTP_STOP);
  return CURLE_OK;
}

Assistant:

static CURLcode InitiateTransfer(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;

  if(conn->bits.ftp_use_data_ssl) {
    /* since we only have a plaintext TCP connection here, we must now
     * do the TLS stuff */
    infof(data, "Doing the SSL/TLS handshake on the data stream");
    result = Curl_ssl_connect(data, conn, SECONDARYSOCKET);
    if(result)
      return result;
  }

  if(conn->proto.ftpc.state_saved == FTP_STOR) {
    /* When we know we're uploading a specified file, we can get the file
       size prior to the actual upload. */
    Curl_pgrsSetUploadSize(data, data->state.infilesize);

    /* set the SO_SNDBUF for the secondary socket for those who need it */
    Curl_sndbufset(conn->sock[SECONDARYSOCKET]);

    Curl_setup_transfer(data, -1, -1, FALSE, SECONDARYSOCKET);
  }
  else {
    /* FTP download: */
    Curl_setup_transfer(data, SECONDARYSOCKET,
                        conn->proto.ftpc.retr_size_saved, FALSE, -1);
  }

  conn->proto.ftpc.pp.pending_resp = TRUE; /* expect server response */
  state(data, FTP_STOP);

  return CURLE_OK;
}